

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall
binlog::PrettyPrinter::printEvent
          (PrettyPrinter *this,ostream *ostr,Event *event,WriterProp *writerProp,
          ClockSync *clockSync)

{
  char c;
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  OstreamBuffer out;
  OstreamBuffer local_440;
  
  detail::OstreamBuffer::OstreamBuffer(&local_440,ostr);
  this->_clockSync = clockSync;
  for (uVar4 = 0; uVar1 = (this->_eventFormat)._M_string_length, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pcVar2 = (this->_eventFormat)._M_dataplus._M_p;
    c = pcVar2[uVar4];
    if ((c == '%') && (uVar3 = uVar4 + 1, uVar4 = uVar1, uVar3 != uVar1)) {
      printEventField(this,&local_440,pcVar2[uVar3],event,writerProp);
      uVar4 = uVar3;
    }
    else {
      detail::OstreamBuffer::put(&local_440,c);
    }
  }
  detail::OstreamBuffer::~OstreamBuffer(&local_440);
  return;
}

Assistant:

void PrettyPrinter::printEvent(
  std::ostream& ostr,
  const Event& event,
  const WriterProp& writerProp,
  const ClockSync& clockSync
)
{
  detail::OstreamBuffer out(ostr);
  _clockSync = &clockSync;

  for (std::size_t i = 0; i < _eventFormat.size(); ++i)
  {
    const char c = _eventFormat[i];
    if (c == '%' && ++i != _eventFormat.size())
    {
      const char spec = _eventFormat[i];
      printEventField(out, spec, event, writerProp);
    }
    else
    {
      out.put(c);
    }
  }
}